

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RS232Port.h
# Opt level: O2

int CloseRS232Port(RS232PORT *pRS232Port)

{
  int iVar1;
  
  switch(pRS232Port->DevType) {
  case 0:
    iVar1 = CloseComputerRS232Port(pRS232Port->hDev);
    return iVar1;
  case 1:
    iVar1 = releasetcpcli(pRS232Port->s);
    return iVar1;
  case 2:
    disconnectclifromtcpsrv(pRS232Port->s);
    iVar1 = releasetcpsrv(pRS232Port->s_srv);
    return iVar1;
  case 3:
    iVar1 = releaseudpcli(pRS232Port->s);
    return iVar1;
  case 4:
    iVar1 = releaseudpsrv(pRS232Port->s_srv);
    return iVar1;
  default:
    return 1;
  }
}

Assistant:

inline int CloseRS232Port(RS232PORT* pRS232Port)
{
	switch (pRS232Port->DevType)
	{
	case TCP_CLIENT_TYPE_RS232PORT:
		return releasetcpcli(pRS232Port->s);
	case TCP_SERVER_TYPE_RS232PORT:
		if (disconnectclifromtcpsrv(pRS232Port->s) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_WARNING_RS232PORT(("CloseRS232Port error (%s) : %s(pRS232Port=%#x)\n", 
				strtime_m(), 
				"Error disconnecting a client. ", 
				pRS232Port));
		}
		return releasetcpsrv(pRS232Port->s_srv);
	case UDP_CLIENT_TYPE_RS232PORT:
		return releaseudpcli(pRS232Port->s);
	case UDP_SERVER_TYPE_RS232PORT:
		if (disconnectclifromudpsrv(pRS232Port->s) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_WARNING_RS232PORT(("CloseRS232Port error (%s) : %s(pRS232Port=%#x)\n", 
				strtime_m(), 
				"Error disconnecting a client. ", 
				pRS232Port));
		}
		return releaseudpsrv(pRS232Port->s_srv);
	case LOCAL_TYPE_RS232PORT:
		return CloseComputerRS232Port(pRS232Port->hDev);
	default:
		PRINT_DEBUG_ERROR_RS232PORT(("CloseRS232Port error (%s) : %s(pRS232Port=%#x)\n", 
			strtime_m(), 
			"Invalid device type. ", 
			pRS232Port));
		return EXIT_FAILURE;
	}
}